

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O2

bool __thiscall SQArray::Get(SQArray *this,SQInteger nidx,SQObjectPtr *val)

{
  SQObjectPtr *pSVar1;
  bool bVar2;
  SQSharedState **ppSVar3;
  SQSharedState *local_18;
  SQObjectValue SStack_10;
  
  bVar2 = nidx < (long)(this->_values)._size;
  if (bVar2 && -1 < nidx) {
    pSVar1 = (this->_values)._vals;
    ppSVar3 = (SQSharedState **)(pSVar1 + nidx);
    if (pSVar1[nidx].super_SQObject._type == OT_WEAKREF) {
      ppSVar3 = &((SQObjectValue *)(ppSVar3 + 1))->pString->_sharedstate;
    }
    local_18 = *ppSVar3;
    SStack_10 = *(SQObjectValue *)(ppSVar3 + 1);
    SQObjectPtr::operator=(val,(SQObject *)&local_18);
  }
  return bVar2 && -1 < nidx;
}

Assistant:

bool Get(const SQInteger nidx,SQObjectPtr &val)
    {
        if(nidx>=0 && nidx<(SQInteger)_values.size()){
            SQObjectPtr &o = _values[nidx];
            val = _realval(o);
            return true;
        }
        else return false;
    }